

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

void __thiscall gl4cts::DirectStateAccess::Framebuffers::ClearTest::Clean(ClearTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  ClearTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_fbo != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo);
    this->m_fbo = 0;
  }
  if (this->m_renderbuffers != (GLuint *)0x0) {
    if (this->m_renderbuffers_count != 0) {
      (**(code **)(lVar3 + 0x460))(this->m_renderbuffers_count,this->m_renderbuffers);
    }
    if (this->m_renderbuffers != (GLuint *)0x0) {
      operator_delete__(this->m_renderbuffers);
    }
    this->m_renderbuffers = (GLuint *)0x0;
    this->m_renderbuffers_count = 0;
  }
  do {
    iVar1 = (**(code **)(lVar3 + 0x800))();
  } while (iVar1 != 0);
  return;
}

Assistant:

void ClearTest::Clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Releasing objects. */
	if (m_fbo)
	{
		gl.deleteFramebuffers(1, &m_fbo);

		m_fbo = 0;
	}

	if (DE_NULL != m_renderbuffers)
	{
		if (m_renderbuffers_count)
		{
			gl.deleteRenderbuffers(m_renderbuffers_count, m_renderbuffers);
		}

		delete[] m_renderbuffers;

		m_renderbuffers		  = DE_NULL;
		m_renderbuffers_count = 0;
	}

	/* Errors clean up. */
	while (gl.getError())
		;
}